

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool gflags::ReadFlagsFromString(string *flagfilecontents,char *param_2,bool errors_are_fatal)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 local_e8 [32];
  undefined1 local_c8 [8];
  CommandLineFlagParser parser;
  undefined1 local_50 [8];
  FlagSaverImpl saved_states;
  FlagRegistry *registry;
  bool errors_are_fatal_local;
  char *param_1_local;
  string *flagfilecontents_local;
  
  saved_states.backup_registry_.
  super__Vector_base<gflags::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)anon_unknown_2::FlagRegistry::GlobalRegistry();
  FlagSaverImpl::FlagSaverImpl
            ((FlagSaverImpl *)local_50,
             (FlagRegistry *)
             saved_states.backup_registry_.
             super__Vector_base<gflags::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<gflags::(anonymous_namespace)::CommandLineFlag_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FlagSaverImpl::SaveFromRegistry((FlagSaverImpl *)local_50);
  anon_unknown_2::CommandLineFlagParser::CommandLineFlagParser
            ((CommandLineFlagParser *)local_c8,
             (FlagRegistry *)
             saved_states.backup_registry_.
             super__Vector_base<gflags::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<gflags::(anonymous_namespace)::CommandLineFlag_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  anon_unknown_2::FlagRegistry::Lock
            ((FlagRegistry *)
             saved_states.backup_registry_.
             super__Vector_base<gflags::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<gflags::(anonymous_namespace)::CommandLineFlag_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  anon_unknown_2::CommandLineFlagParser::ProcessOptionsFromStringLocked
            ((CommandLineFlagParser *)local_e8,(string *)local_c8,(FlagSettingMode)flagfilecontents)
  ;
  std::__cxx11::string::~string((string *)local_e8);
  anon_unknown_2::FlagRegistry::Unlock
            ((FlagRegistry *)
             saved_states.backup_registry_.
             super__Vector_base<gflags::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<gflags::(anonymous_namespace)::CommandLineFlag_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  HandleCommandLineHelpFlags();
  bVar1 = anon_unknown_2::CommandLineFlagParser::ReportErrors((CommandLineFlagParser *)local_c8);
  if (bVar1) {
    if (errors_are_fatal) {
      uVar2 = (*(code *)gflags_exitfunc)(1);
      return (bool)uVar2;
    }
    FlagSaverImpl::RestoreToRegistry((FlagSaverImpl *)local_50);
    flagfilecontents_local._7_1_ = false;
  }
  else {
    flagfilecontents_local._7_1_ = true;
  }
  anon_unknown_2::CommandLineFlagParser::~CommandLineFlagParser((CommandLineFlagParser *)local_c8);
  FlagSaverImpl::~FlagSaverImpl((FlagSaverImpl *)local_50);
  return flagfilecontents_local._7_1_;
}

Assistant:

bool ReadFlagsFromString(const string& flagfilecontents,
                         const char* /*prog_name*/,  // TODO(csilvers): nix this
                         bool errors_are_fatal) {
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagSaverImpl saved_states(registry);
  saved_states.SaveFromRegistry();

  CommandLineFlagParser parser(registry);
  registry->Lock();
  parser.ProcessOptionsFromStringLocked(flagfilecontents, SET_FLAGS_VALUE);
  registry->Unlock();
  // Should we handle --help and such when reading flags from a string?  Sure.
  HandleCommandLineHelpFlags();
  if (parser.ReportErrors()) {
    // Error.  Restore all global flags to their previous values.
    if (errors_are_fatal)
      gflags_exitfunc(1);
    saved_states.RestoreToRegistry();
    return false;
  }
  return true;
}